

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O2

void anon_unknown.dwarf_b3fd::WriteOneParameter(FILE *fp,char *text,double parameter,int size)

{
  double *__ptr;
  size_t sStack_30;
  double parameter_local;
  int parameter_int;
  
  parameter_local = parameter;
  fwrite(text,1,4,(FILE *)fp);
  if (size == 4) {
    parameter_int = (int)parameter;
    __ptr = (double *)&parameter_int;
    sStack_30 = 4;
  }
  else {
    __ptr = &parameter_local;
    sStack_30 = 8;
  }
  fwrite(__ptr,sStack_30,1,(FILE *)fp);
  return;
}

Assistant:

static void WriteOneParameter(FILE *fp, const char *text,
    double parameter, int size) {
  fwrite(text, 1, 4, fp);
  if (size == 4) {
    int parameter_int = static_cast<int>(parameter);
    fwrite(&parameter_int, 4, 1, fp);
  } else {
    fwrite(&parameter, 8, 1, fp);
  }
}